

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int xz_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  ssize_t local_30;
  ssize_t avail;
  uchar *buffer;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  buffer = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,6,&local_30);
  if ((void *)avail == (void *)0x0) {
    self_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp((void *)avail,anon_var_dwarf_594af,6);
    if (iVar1 == 0) {
      self_local._4_4_ = 0x30;
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
xz_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;

	(void)self; /* UNUSED */

	buffer = __archive_read_filter_ahead(filter, 6, &avail);
	if (buffer == NULL)
		return (0);

	/*
	 * Verify Header Magic Bytes : FD 37 7A 58 5A 00
	 */
	if (memcmp(buffer, "\xFD\x37\x7A\x58\x5A\x00", 6) != 0)
		return (0);

	return (48);
}